

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::FamilyTest_throw_on_invalid_metric_name_Test::TestBody
          (FamilyTest_throw_on_invalid_metric_name_Test *this)

{
  bool bVar1;
  AssertHelper local_40;
  Message local_38;
  unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
  local_30 [3];
  byte local_12;
  bool gtest_caught_any;
  FamilyTest_throw_on_invalid_metric_name_Test *pFStack_10;
  anon_class_1_0_00000001 create_family_with_invalid_name;
  FamilyTest_throw_on_invalid_metric_name_Test *this_local;
  
  pFStack_10 = this;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_12 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TestBody::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)local_30);
      std::
      unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
      ::~unique_ptr(local_30);
    }
    if ((local_12 & 1) != 0) {
      return;
    }
  }
  testing::Message::Message(&local_38);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/family_test.cc"
             ,0x57,
             "Expected: create_family_with_invalid_name() throws an exception.\n  Actual: it doesn\'t."
            );
  testing::internal::AssertHelper::operator=(&local_40,&local_38);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  testing::Message::~Message(&local_38);
  return;
}

Assistant:

TEST(FamilyTest, throw_on_invalid_metric_name) {
  auto create_family_with_invalid_name = []() {
    return detail::make_unique<Family<Counter>>("", "empty name", Labels{});
  };
  EXPECT_ANY_THROW(create_family_with_invalid_name());
}